

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O3

int AF_AActor_ResolveState
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int pos;
  PClass *pPVar1;
  PClass *pPVar2;
  PClassActor *cls;
  FState *val;
  char *pcVar3;
  undefined8 *puVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (0 < numparam) {
    if ((param->field_0).field_3.Type != '\x03') {
LAB_00456935:
      pcVar3 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_0045694e;
    }
    puVar4 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar4 != (undefined8 *)0x0) {
        pPVar2 = (PClass *)puVar4[1];
        if (pPVar2 == (PClass *)0x0) {
          pPVar2 = (PClass *)(**(code **)*puVar4)(puVar4);
          puVar4[1] = pPVar2;
        }
        bVar6 = pPVar2 == (PClass *)0x0;
        bVar7 = !bVar6;
        defaultparam = (TArray<VMValue,_VMValue> *)(ulong)(pPVar2 == pPVar1 || bVar6);
        if (pPVar2 != pPVar1 && !bVar6) {
          do {
            pPVar2 = pPVar2->ParentClass;
            bVar7 = pPVar2 != (PClass *)0x0;
            if (pPVar2 == pPVar1) break;
          } while (pPVar2 != (PClass *)0x0);
        }
        if (!bVar7) {
          pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0045694e;
        }
      }
    }
    else if (puVar4 != (undefined8 *)0x0) goto LAB_00456935;
    pPVar1 = AActor::RegistrationInfo.MyClass;
    if (numparam == 1) goto LAB_0045693e;
    if (param[1].field_0.field_3.Type != '\x03') goto LAB_00456935;
    puVar4 = (undefined8 *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if (puVar4 == (undefined8 *)0x0) goto LAB_004568a7;
      pPVar2 = (PClass *)puVar4[1];
      if (pPVar2 == (PClass *)0x0) {
        pPVar2 = (PClass *)(**(code **)*puVar4)(puVar4,defaultparam);
        puVar4[1] = pPVar2;
      }
      bVar7 = pPVar2 != (PClass *)0x0;
      if (pPVar2 != pPVar1 && bVar7) {
        do {
          pPVar2 = pPVar2->ParentClass;
          bVar7 = pPVar2 != (PClass *)0x0;
          if (pPVar2 == pPVar1) break;
        } while (pPVar2 != (PClass *)0x0);
      }
      if (!bVar7) {
        pcVar3 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_0045694e;
      }
    }
    else {
      if (puVar4 != (undefined8 *)0x0) goto LAB_00456935;
LAB_004568a7:
      puVar4 = (undefined8 *)0x0;
    }
    if (2 < numparam) {
      if (param[2].field_0.field_3.Type == '\x03') {
        if (numparam == 3) {
          pcVar3 = "(paramnum) < numparam";
        }
        else {
          if (param[3].field_0.field_3.Type == '\0') {
            pos = param[3].field_0.i;
            cls = (PClassActor *)puVar4[1];
            if (cls == (PClassActor *)0x0) {
              cls = (PClassActor *)(**(code **)*puVar4)(puVar4);
              puVar4[1] = cls;
            }
            iVar5 = 0;
            val = FStateLabelStorage::GetState(&StateLabels,pos,cls,false);
            if (0 < numret) {
              if (ret == (VMReturn *)0x0) {
                __assert_fail("ret != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_states.cpp"
                              ,0x15e,
                              "int AF_AActor_ResolveState(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              VMReturn::SetPointer(ret,val,0);
              iVar5 = 1;
            }
            return iVar5;
          }
          pcVar3 = "param[paramnum].Type == REGT_INT";
        }
        __assert_fail(pcVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_states.cpp"
                      ,0x15d,
                      "int AF_AActor_ResolveState(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pcVar3 = "param[paramnum].Type == REGT_POINTER";
      goto LAB_0045694e;
    }
  }
LAB_0045693e:
  pcVar3 = "(paramnum) < numparam";
LAB_0045694e:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_states.cpp"
                ,0x15c,
                "int AF_AActor_ResolveState(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, ResolveState)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_STATE_ACTION(newstate);
	ACTION_RETURN_STATE(newstate);
}